

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.h
# Opt level: O0

void __thiscall
gutil::Properties::putValue<gmath::SMatrix<double,3,3>>
          (Properties *this,char *key,SMatrix<double,_3,_3> *value)

{
  string *in_RSI;
  char *in_RDI;
  ostringstream out;
  ostringstream *this_00;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_fffffffffffffe40;
  ostringstream local_190 [384];
  string *local_10;
  
  this_00 = local_190;
  local_10 = in_RSI;
  std::__cxx11::ostringstream::ostringstream(this_00);
  gmath::operator<<(in_stack_fffffffffffffe40,(SMatrix<double,_3,_3> *)this_00);
  std::__cxx11::ostringstream::str();
  gutil::Properties::putString(in_RDI,local_10);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe40);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return;
}

Assistant:

void putValue(const char *key, const T &value)
    {
      std::ostringstream out;
      out << value;
      putString(key, out.str());
    }